

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Try(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
      *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  undefined1 uVar5;
  bool bVar6;
  eval_error *peVar7;
  allocator<char> local_ca;
  undefined1 local_c9;
  string local_c8;
  File_Position local_a8;
  Depth_Counter dc;
  string local_90;
  string local_70;
  string local_50;
  
  Depth_Counter::Depth_Counter(&dc,this);
  puVar1 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8._M_dataplus._M_p = (pointer)0x3;
  local_c8._M_string_length = 0x5a8a7c;
  uVar5 = Keyword(this,(Static_String *)&local_c8);
  if ((bool)uVar5) {
    do {
      bVar6 = Eol(this);
    } while (bVar6);
    bVar6 = Block(this);
    local_c9 = uVar5;
    if (!bVar6) {
      peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"Incomplete \'try\' block",&local_ca);
      local_a8.line = (this->m_position).line;
      local_a8.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar7,&local_c8,&local_a8,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    while( true ) {
      do {
        bVar6 = Eol(this);
      } while (bVar6);
      local_c8._M_dataplus._M_p = (pointer)0x5;
      local_c8._M_string_length = 0x5a8a97;
      bVar6 = Keyword(this,(Static_String *)&local_c8);
      uVar5 = local_c9;
      if (!bVar6) break;
      puVar3 = (this->m_match_stack).
               super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar4 = (this->m_match_stack).
               super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar6 = Char(this,'(');
      if ((bVar6) && ((bVar6 = Arg(this,true), !bVar6 || (bVar6 = Char(this,')'), !bVar6)))) {
        peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"Incomplete \'catch\' expression",&local_ca);
        local_a8.line = (this->m_position).line;
        local_a8.column = (this->m_position).col;
        exception::eval_error::eval_error
                  (peVar7,&local_c8,&local_a8,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      do {
        bVar6 = Eol(this);
      } while (bVar6);
      bVar6 = Block(this);
      if (!bVar6) {
        peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"Incomplete \'catch\' block",&local_ca);
        local_a8.line = (this->m_position).line;
        local_a8.column = (this->m_position).col;
        exception::eval_error::eval_error
                  (peVar7,&local_c8,&local_a8,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"",(allocator<char> *)&local_c8);
      ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
      ::build_match<chaiscript::eval::Catch_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
                ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                  *)this,(long)puVar3 - (long)puVar4 >> 3,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    do {
      bVar6 = Eol(this);
    } while (bVar6);
    local_c8._M_dataplus._M_p = (pointer)0x7;
    local_c8._M_string_length = 0x5a8ad4;
    bVar6 = Keyword(this,(Static_String *)&local_c8);
    if (bVar6) {
      puVar3 = (this->m_match_stack).
               super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar4 = (this->m_match_stack).
               super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar6 = Eol(this);
      } while (bVar6);
      bVar6 = Block(this);
      if (!bVar6) {
        peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"Incomplete \'finally\' block",&local_ca);
        local_a8.line = (this->m_position).line;
        local_a8.column = (this->m_position).col;
        exception::eval_error::eval_error
                  (peVar7,&local_c8,&local_a8,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"",(allocator<char> *)&local_c8);
      ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
      ::build_match<chaiscript::eval::Finally_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
                ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                  *)this,(long)puVar3 - (long)puVar4 >> 3,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"",(allocator<char> *)&local_c8);
    ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::build_match<chaiscript::eval::Try_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)this,(long)puVar1 - (long)puVar2 >> 3,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  (dc.parser)->m_current_parse_depth = (dc.parser)->m_current_parse_depth - 1;
  return (bool)uVar5;
}

Assistant:

bool Try() {
        Depth_Counter dc{this};
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (Keyword("try")) {
          retval = true;

          while (Eol()) {
          }

          if (!Block()) {
            throw exception::eval_error("Incomplete 'try' block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          bool has_matches = true;
          while (has_matches) {
            while (Eol()) {
            }
            has_matches = false;
            if (Keyword("catch")) {
              const auto catch_stack_top = m_match_stack.size();
              if (Char('(')) {
                if (!(Arg() && Char(')'))) {
                  throw exception::eval_error("Incomplete 'catch' expression",
                                              File_Position(m_position.line, m_position.col),
                                              *m_filename);
                }
              }

              while (Eol()) {
              }

              if (!Block()) {
                throw exception::eval_error("Incomplete 'catch' block", File_Position(m_position.line, m_position.col), *m_filename);
              }
              build_match<eval::Catch_AST_Node<Tracer>>(catch_stack_top);
              has_matches = true;
            }
          }
          while (Eol()) {
          }
          if (Keyword("finally")) {
            const auto finally_stack_top = m_match_stack.size();

            while (Eol()) {
            }

            if (!Block()) {
              throw exception::eval_error("Incomplete 'finally' block", File_Position(m_position.line, m_position.col), *m_filename);
            }
            build_match<eval::Finally_AST_Node<Tracer>>(finally_stack_top);
          }

          build_match<eval::Try_AST_Node<Tracer>>(prev_stack_top);
        }

        return retval;
      }